

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

int __thiscall File::truncate(File *this,char *__file,__off_t __length)

{
  int iVar1;
  
  if (this->valid == true) {
    iVar1 = fileno((FILE *)this->stream);
    iVar1 = ftruncate(iVar1,0);
    return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0);
  }
  return 0;
}

Assistant:

bool File::truncate()
{
	if (!valid) return false;

#ifndef _WIN32
	return (::ftruncate(fileno(stream), 0) == 0);
#else
	return (_chsize(_fileno(stream), 0) == 0);
#endif
}